

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

UploadSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
          *samples,bool logBucketPerformance)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer pUVar3;
  pointer pfVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  deUint64 *pdVar7;
  int *piVar8;
  pointer pUVar9;
  SampleBuilder *pSVar10;
  uint uVar11;
  ulong target;
  long lVar12;
  int endNdx;
  long lVar13;
  size_type __n;
  ulong uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  UploadSampleAnalyzeResult UVar21;
  vector<float,_std::allocator<float>_> processingRates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  LineParametersWithConfidence contributionFitting;
  size_type __dnew;
  ScopedLogSection section_1;
  LineParametersWithConfidence theilSenFitting;
  size_type __dnew_1;
  ScopedLogSection section;
  ScopedLogSection section_2;
  StatsType resultStats;
  undefined1 local_ac8 [12];
  float fStack_abc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ab8;
  string local_aa8;
  string local_a88;
  qpSampleValueTag local_a68;
  float local_a64;
  undefined1 local_a60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a50;
  string local_a40;
  string local_a20;
  qpSampleValueTag local_a00;
  float local_9fc;
  undefined1 local_9f8 [16];
  undefined1 local_9e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9d0;
  LogNumber<float> local_9c0;
  LogNumber<float> local_958;
  string local_8f0;
  LogNumber<float> local_8d0;
  LogNumber<float> local_868;
  LineParametersWithConfidence local_7fc;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  LogNumber<float> local_620;
  string local_5b8;
  string local_598;
  string local_578;
  float local_554;
  float local_550;
  float local_54c;
  float local_548;
  float local_544;
  float local_540;
  float local_53c;
  float local_538;
  float local_534;
  float local_530;
  float local_52c;
  LogNumber<float> local_528;
  LogNumber<float> local_4c0;
  LogNumber<float> local_458;
  LogNumber<float> local_3f0;
  LogNumber<float> local_388;
  string local_320;
  ScopedLogSection local_300;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  SingleOperationStatistics local_f8;
  SingleOperationStatistics local_e4;
  SingleOperationStatistics local_d0 [2];
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  undefined4 uStack_90;
  float fStack_8c;
  float fStack_88;
  undefined4 local_84;
  float local_80;
  float local_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            (&local_7fc,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,
             0x20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a60,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
             (allocator_type *)local_ac8);
  pUVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = ((long)(samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9 >> 3) * 0x6db6db6db6db6db7
  ;
  uVar11 = (uint)__n;
  if (0 < (int)uVar11) {
    pdVar7 = &(pUVar9->duration).fitResponseDuration;
    uVar14 = 0;
    do {
      *(deUint64 *)(local_a60._0_8_ + uVar14 * 8) = *pdVar7;
      uVar14 = uVar14 + 1;
      pdVar7 = pdVar7 + 7;
    } while ((uVar11 & 0x7fffffff) != uVar14);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_ac8,__n,(allocator_type *)&local_9c0);
  uVar5 = local_ac8._0_8_;
  pUVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9 >> 3) *
           -0x49249249;
  if (0 < (int)uVar11) {
    piVar8 = &pUVar9->writtenSize;
    uVar14 = 0;
    do {
      *(float *)(local_ac8._0_8_ + uVar14 * 4) =
           (float)*piVar8 / (((float)*(ulong *)(local_a60._0_8_ + uVar14 * 8) / 1000.0) / 1000.0);
      uVar14 = uVar14 + 1;
      piVar8 = piVar8 + 0xe;
    } while ((uVar11 & 0x7fffffff) != uVar14);
  }
  pfVar4 = (pointer)CONCAT44(fStack_abc,local_ac8._8_4_);
  if ((pointer)local_ac8._0_8_ != pfVar4) {
    uVar14 = (long)pfVar4 - local_ac8._0_8_ >> 2;
    lVar12 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_ac8._0_8_,pfVar4,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar5,pfVar4);
  }
  uVar5 = local_ac8._0_8_;
  fVar16 = (float)((CONCAT44(fStack_abc,local_ac8._8_4_) - local_ac8._0_8_ >> 2) - 1) * 0.5;
  fVar17 = floorf(fVar16);
  fVar16 = fVar16 - (float)(int)fVar17;
  local_94 = (1.0 - fVar16) * *(float *)(uVar5 + (long)(int)fVar17 * 4) +
             fVar16 * *(float *)(uVar5 + (long)((int)fVar17 + 1) * 4);
  if ((pointer)uVar5 != (pointer)0x0) {
    operator_delete((void *)uVar5,local_ab8._M_allocated_capacity - uVar5);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_ac8,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
             (allocator_type *)&local_9c0);
  uVar5 = local_ac8._0_8_;
  pUVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9 >> 3) *
           -0x49249249;
  if (0 < (int)uVar11) {
    piVar8 = &pUVar9->writtenSize;
    uVar14 = 0;
    do {
      *(float *)(local_ac8._0_8_ + uVar14 * 4) =
           (float)*(ulong *)(local_a60._0_8_ + uVar14 * 8) -
           ((float)*piVar8 * local_7fc.coefficient + local_7fc.offset);
      uVar14 = uVar14 + 1;
      piVar8 = piVar8 + 0xe;
    } while ((uVar11 & 0x7fffffff) != uVar14);
  }
  pfVar4 = (pointer)CONCAT44(fStack_abc,local_ac8._8_4_);
  if ((pointer)local_ac8._0_8_ != pfVar4) {
    uVar14 = (long)pfVar4 - local_ac8._0_8_ >> 2;
    lVar12 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_ac8._0_8_,pfVar4,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar5,pfVar4);
  }
  uVar5 = local_ac8._0_8_;
  uStack_90 = *(undefined4 *)(CONCAT44(fStack_abc,local_ac8._8_4_) + -4);
  fVar17 = (float)((CONCAT44(fStack_abc,local_ac8._8_4_) - local_ac8._0_8_ >> 2) - 1);
  local_9f8._0_4_ = fVar17 * 0.9;
  fVar16 = floorf((float)local_9f8._0_4_);
  fStack_8c = (1.0 - ((float)local_9f8._0_4_ - (float)(int)fVar16)) *
              *(float *)(uVar5 + (long)(int)fVar16 * 4) +
              ((float)local_9f8._0_4_ - (float)(int)fVar16) *
              *(float *)(uVar5 + (long)((int)fVar16 + 1) * 4);
  fVar17 = fVar17 * 0.5;
  fVar16 = floorf(fVar17);
  fVar17 = fVar17 - (float)(int)fVar16;
  fStack_88 = (1.0 - fVar17) * *(float *)(uVar5 + (long)(int)fVar16 * 4) +
              fVar17 * *(float *)(uVar5 + (long)((int)fVar16 + 1) * 4);
  if ((pointer)uVar5 != (pointer)0x0) {
    operator_delete((void *)uVar5,local_ab8._M_allocated_capacity - uVar5);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_ac8,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
             (allocator_type *)&local_9c0);
  uVar5 = local_ac8._0_8_;
  pUVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9 >> 3) *
           -0x49249249;
  if (0 < (int)uVar11) {
    piVar8 = &pUVar9->writtenSize;
    uVar14 = 0;
    do {
      fVar16 = (float)*piVar8 * local_7fc.coefficient + local_7fc.offset;
      fVar17 = 0.0;
      if (1.0 <= fVar16) {
        fVar17 = ((float)*(ulong *)(local_a60._0_8_ + uVar14 * 8) - fVar16) / fVar16;
      }
      *(float *)(local_ac8._0_8_ + uVar14 * 4) = fVar17;
      uVar14 = uVar14 + 1;
      piVar8 = piVar8 + 0xe;
    } while ((uVar11 & 0x7fffffff) != uVar14);
  }
  pfVar4 = (pointer)CONCAT44(fStack_abc,local_ac8._8_4_);
  if ((pointer)local_ac8._0_8_ != pfVar4) {
    uVar14 = (long)pfVar4 - local_ac8._0_8_ >> 2;
    lVar12 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_ac8._0_8_,pfVar4,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar5,pfVar4);
  }
  local_84 = *(undefined4 *)(CONCAT44(fStack_abc,local_ac8._8_4_) + -4);
  fVar17 = (float)((CONCAT44(fStack_abc,local_ac8._8_4_) - local_ac8._0_8_ >> 2) - 1);
  fVar16 = fVar17 * 0.9;
  local_9f8._0_4_ = fVar16;
  fVar16 = floorf(fVar16);
  local_80 = (1.0 - ((float)local_9f8._0_4_ - (float)(int)fVar16)) *
             *(float *)(local_ac8._0_8_ + (long)(int)fVar16 * 4) +
             ((float)local_9f8._0_4_ - (float)(int)fVar16) *
             *(float *)(local_ac8._0_8_ + (long)((int)fVar16 + 1) * 4);
  fVar17 = fVar17 * 0.5;
  fVar16 = floorf(fVar17);
  fVar17 = fVar17 - (float)(int)fVar16;
  local_7c = (1.0 - fVar17) * *(float *)(local_ac8._0_8_ + (long)(int)fVar16 * 4) +
             fVar17 * *(float *)(local_ac8._0_8_ + (long)((int)fVar16 + 1) * 4);
  if ((pointer)local_ac8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_ac8._0_8_,local_ab8._M_allocated_capacity - local_ac8._0_8_);
  }
  uVar6 = local_a60._8_8_;
  uVar5 = local_a60._0_8_;
  if (local_a60._0_8_ != local_a60._8_8_) {
    uVar14 = (long)(local_a60._8_8_ - local_a60._0_8_) >> 3;
    lVar12 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a60._0_8_,local_a60._8_8_,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar5,uVar6);
  }
  local_a8 = (float)*(ulong *)local_a60._0_8_;
  local_a4 = (float)(ulong)(((pointer)(local_a60._8_8_ + -0x10))->value).int64;
  fVar17 = (float)(((long)(local_a60._8_8_ - local_a60._0_8_) >> 3) - 1);
  local_9f8._0_4_ = fVar17 * 0.5;
  fVar16 = floorf(fVar17 * 0.5);
  local_a0 = (float)*(ulong *)(local_a60._0_8_ + (long)((int)fVar16 + 1) * 8) *
             ((float)local_9f8._0_4_ - (float)(int)fVar16) +
             (float)*(ulong *)(local_a60._0_8_ + (long)(int)fVar16 * 8) *
             (1.0 - ((float)local_9f8._0_4_ - (float)(int)fVar16));
  local_9f8._0_4_ = fVar17 * 0.1;
  fVar16 = floorf(fVar17 * 0.1);
  local_9c = (float)*(ulong *)(local_a60._0_8_ + (long)((int)fVar16 + 1) * 8) *
             ((float)local_9f8._0_4_ - (float)(int)fVar16) +
             (float)*(ulong *)(local_a60._0_8_ + (long)(int)fVar16 * 8) *
             (1.0 - ((float)local_9f8._0_4_ - (float)(int)fVar16));
  fVar16 = floorf(fVar17 * 0.9);
  uVar14 = *(ulong *)(local_a60._0_8_ + (long)(int)fVar16 * 8);
  target = uVar14;
  if ((long)uVar14 < 0) {
    target = (ulong)((uint)uVar14 & 1) | uVar14 >> 1;
  }
  fVar17 = fVar17 * 0.9 - (float)(int)fVar16;
  uVar2 = *(ulong *)(local_a60._0_8_ + (long)((int)fVar16 + 1) * 8);
  if ((long)uVar2 < 0) {
    target = uVar2 >> 1;
  }
  local_98 = (float)uVar2 * fVar17 + (float)uVar14 * (1.0 - fVar17);
  operator_delete((void *)local_a60._0_8_,aStack_a50._M_allocated_capacity - local_a60._0_8_);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>>
            (&local_f8,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              *)0x0,target);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>>
            (&local_e4,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              *)0x8,target);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>>
            (local_d0,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              *)0x10,target);
  local_a60._0_8_ = &aStack_a50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a60,"Samples","");
  local_ac8._0_8_ = &local_ab8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"Samples","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_320,log,(string *)local_a60,(string *)local_ac8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._0_8_ != &local_ab8) {
    operator_delete((void *)local_ac8._0_8_,local_ab8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60._0_8_ != &aStack_a50) {
    operator_delete((void *)local_a60._0_8_,aStack_a50._M_allocated_capacity + 1);
  }
  local_388.m_name._M_dataplus._M_p = (pointer)&local_388.m_name.field_2;
  local_388.m_name.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
  local_388.m_name._M_string_length = 7;
  local_388.m_name.field_2._M_allocated_capacity._4_4_ = 0x73656c;
  local_8d0.m_name._M_dataplus._M_p = (pointer)&local_8d0.m_name.field_2;
  local_8d0.m_name.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
  local_8d0.m_name.field_2._M_local_buf[4] = 'l';
  local_8d0.m_name.field_2._M_allocated_capacity._5_2_ = 0x7365;
  local_8d0.m_name._M_string_length = 7;
  local_8d0.m_name.field_2._M_local_buf[7] = '\0';
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_4c0,&local_388.m_name,&local_8d0.m_name)
  ;
  tcu::TestLog::startSampleList(log,&local_4c0.m_name,&local_4c0.m_desc);
  tcu::TestLog::startSampleInfo(log);
  local_3f0.m_name._M_dataplus._M_p = (pointer)&local_3f0.m_name.field_2;
  local_3f0.m_name.field_2._M_allocated_capacity._0_7_ = 0x6e657474697257;
  local_3f0.m_name.field_2._7_4_ = 0x657a6953;
  local_3f0.m_name._M_string_length = 0xb;
  local_3f0.m_name.field_2._M_local_buf[0xb] = '\0';
  local_458.m_name._M_dataplus._M_p = (pointer)&local_458.m_name.field_2;
  local_458.m_name.field_2._M_allocated_capacity = 0x206e657474697257;
  local_458.m_name.field_2._8_4_ = 0x657a6973;
  local_458.m_name._M_string_length = 0xc;
  local_458.m_name.field_2._M_local_buf[0xc] = '\0';
  local_9e0._0_8_ = &local_9d0;
  local_9d0._M_allocated_capacity._0_4_ = 0x65747962;
  local_9d0._M_allocated_capacity._4_2_ = 0x73;
  local_9e0._8_8_ = 5;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_a60,&local_3f0.m_name,&local_458.m_name,(string *)local_9e0,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_a60,&local_a40,&local_a20,local_a00);
  local_8f0.field_2._M_allocated_capacity = 0x6953726566667542;
  local_8f0.field_2._8_2_ = 0x657a;
  local_8f0._M_string_length = 10;
  local_8f0.field_2._M_local_buf[10] = '\0';
  local_578.field_2._M_allocated_capacity._0_7_ = 0x20726566667542;
  local_578.field_2._7_4_ = 0x657a6973;
  local_578._M_string_length = 0xb;
  local_578.field_2._M_local_buf[0xb] = '\0';
  local_598.field_2._M_allocated_capacity._0_4_ = 0x65747962;
  local_598.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_598._M_string_length = 5;
  local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_ac8,&local_8f0,&local_578,&local_598,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_ac8,&local_aa8,&local_a88,local_a68);
  local_5b8.field_2._M_allocated_capacity = 0x6d69546c61746f54;
  local_5b8.field_2._8_2_ = 0x65;
  local_5b8._M_string_length = 9;
  local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
  local_640.field_2._M_allocated_capacity = 0x6974206c61746f54;
  local_640.field_2._8_2_ = 0x656d;
  local_640._M_string_length = 10;
  local_640.field_2._M_local_buf[10] = '\0';
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  local_660.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_660._M_string_length = 2;
  local_660.field_2._M_local_buf[2] = '\0';
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_9c0,&local_5b8,&local_640,&local_660,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_9c0.m_name,&local_9c0.m_desc,&local_9c0.m_unit,local_9c0.m_tag);
  local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
  local_680.field_2._M_allocated_capacity._0_4_ = 0x5470614d;
  local_680._M_string_length = 7;
  local_680.field_2._M_allocated_capacity._4_4_ = 0x656d69;
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  local_6a0.field_2._M_allocated_capacity = 0x656d69742070614d;
  local_6a0._M_string_length = 8;
  local_6a0.field_2._M_local_buf[8] = '\0';
  local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
  local_6c0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_6c0._M_string_length = 2;
  local_6c0.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_868,&local_680,&local_6a0,&local_6c0,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_868.m_name,&local_868.m_desc,&local_868.m_unit,local_868.m_tag);
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  local_6e0.field_2._M_allocated_capacity = 0x6d695470616d6e55;
  local_6e0.field_2._8_2_ = 0x65;
  local_6e0._M_string_length = 9;
  local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
  local_700.field_2._M_allocated_capacity = 0x69742070616d6e55;
  local_700.field_2._8_2_ = 0x656d;
  local_700._M_string_length = 10;
  local_700.field_2._M_local_buf[10] = '\0';
  local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
  local_720.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_720._M_string_length = 2;
  local_720.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_620,&local_6e0,&local_700,&local_720,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_620.m_name,&local_620.m_desc,&local_620.m_unit,local_620.m_tag);
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  local_740.field_2._M_allocated_capacity = 0x6d69546574697257;
  local_740.field_2._8_2_ = 0x65;
  local_740._M_string_length = 9;
  local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
  local_760.field_2._M_allocated_capacity = 0x6974206574697257;
  local_760.field_2._8_2_ = 0x656d;
  local_760._M_string_length = 10;
  local_760.field_2._M_local_buf[10] = '\0';
  local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
  local_780.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_780._M_string_length = 2;
  local_780.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_528,&local_740,&local_760,&local_780,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_528.m_name,&local_528.m_desc,&local_528.m_unit,local_528.m_tag);
  local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
  local_7a0.field_2._M_allocated_capacity._0_7_ = 0x69736552746946;
  local_7a0.field_2._7_4_ = 0x6c617564;
  local_7a0._M_string_length = 0xb;
  local_7a0.field_2._M_local_buf[0xb] = '\0';
  local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
  local_7c0.field_2._M_allocated_capacity = 0x6973657220746946;
  local_7c0.field_2._8_4_ = 0x6c617564;
  local_7c0._M_string_length = 0xc;
  local_7c0.field_2._M_local_buf[0xc] = '\0';
  local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
  local_7e0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_7e0._M_string_length = 2;
  local_7e0.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_958,&local_7a0,&local_7c0,&local_7e0,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_958.m_name,&local_958.m_desc,&local_958.m_unit,local_958.m_tag);
  tcu::TestLog::endSampleInfo(log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_unit._M_dataplus._M_p != &local_958.m_unit.field_2) {
    operator_delete(local_958.m_unit._M_dataplus._M_p,
                    local_958.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_desc._M_dataplus._M_p != &local_958.m_desc.field_2) {
    operator_delete(local_958.m_desc._M_dataplus._M_p,
                    local_958.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_name._M_dataplus._M_p != &local_958.m_name.field_2) {
    operator_delete(local_958.m_name._M_dataplus._M_p,
                    CONCAT17(local_958.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_958.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_958.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
    operator_delete(local_7e0._M_dataplus._M_p,
                    CONCAT53(local_7e0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_7e0.field_2._M_local_buf[2],
                                      local_7e0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
    operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
    operator_delete(local_7a0._M_dataplus._M_p,
                    CONCAT17(local_7a0.field_2._M_local_buf[7],
                             local_7a0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528.m_unit._M_dataplus._M_p != &local_528.m_unit.field_2) {
    operator_delete(local_528.m_unit._M_dataplus._M_p,
                    local_528.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528.m_desc._M_dataplus._M_p != &local_528.m_desc.field_2) {
    operator_delete(local_528.m_desc._M_dataplus._M_p,
                    local_528.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528.m_name._M_dataplus._M_p != &local_528.m_name.field_2) {
    operator_delete(local_528.m_name._M_dataplus._M_p,
                    CONCAT53(local_528.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_528.m_name.field_2._M_local_buf[2],
                                      local_528.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780._M_dataplus._M_p != &local_780.field_2) {
    operator_delete(local_780._M_dataplus._M_p,
                    CONCAT53(local_780.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_780.field_2._M_local_buf[2],
                                      local_780.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._M_dataplus._M_p != &local_760.field_2) {
    operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620.m_unit._M_dataplus._M_p != &local_620.m_unit.field_2) {
    operator_delete(local_620.m_unit._M_dataplus._M_p,
                    local_620.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620.m_desc._M_dataplus._M_p != &local_620.m_desc.field_2) {
    operator_delete(local_620.m_desc._M_dataplus._M_p,
                    local_620.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620.m_name._M_dataplus._M_p != &local_620.m_name.field_2) {
    operator_delete(local_620.m_name._M_dataplus._M_p,
                    local_620.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_720._M_dataplus._M_p != &local_720.field_2) {
    operator_delete(local_720._M_dataplus._M_p,
                    CONCAT53(local_720.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_720.field_2._M_local_buf[2],
                                      local_720.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700._M_dataplus._M_p != &local_700.field_2) {
    operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868.m_unit._M_dataplus._M_p != &local_868.m_unit.field_2) {
    operator_delete(local_868.m_unit._M_dataplus._M_p,
                    local_868.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868.m_desc._M_dataplus._M_p != &local_868.m_desc.field_2) {
    operator_delete(local_868.m_desc._M_dataplus._M_p,
                    local_868.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868.m_name._M_dataplus._M_p != &local_868.m_name.field_2) {
    operator_delete(local_868.m_name._M_dataplus._M_p,
                    CONCAT17(local_868.m_name.field_2._M_local_buf[7],
                             local_868.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
    operator_delete(local_6c0._M_dataplus._M_p,
                    CONCAT53(local_6c0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_6c0.field_2._M_local_buf[2],
                                      local_6c0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_680._M_dataplus._M_p != &local_680.field_2) {
    operator_delete(local_680._M_dataplus._M_p,
                    CONCAT44(local_680.field_2._M_allocated_capacity._4_4_,
                             local_680.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0.m_unit._M_dataplus._M_p != &local_9c0.m_unit.field_2) {
    operator_delete(local_9c0.m_unit._M_dataplus._M_p,
                    local_9c0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0.m_desc._M_dataplus._M_p != &local_9c0.m_desc.field_2) {
    operator_delete(local_9c0.m_desc._M_dataplus._M_p,
                    local_9c0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0.m_name._M_dataplus._M_p != &local_9c0.m_name.field_2) {
    operator_delete(local_9c0.m_name._M_dataplus._M_p,
                    local_9c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p,
                    CONCAT53(local_660.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_660.field_2._M_local_buf[2],
                                      local_660.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != &local_640.field_2) {
    operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._0_8_ != &local_ab8) {
    operator_delete((void *)local_ac8._0_8_,local_ab8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,
                    CONCAT26(local_598.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_598.field_2._M_allocated_capacity._4_2_,
                                      local_598.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,
                    CONCAT17(local_578.field_2._M_local_buf[7],
                             local_578.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
    operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
    operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40._M_dataplus._M_p != &local_a40.field_2) {
    operator_delete(local_a40._M_dataplus._M_p,local_a40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60._0_8_ != &aStack_a50) {
    operator_delete((void *)local_a60._0_8_,aStack_a50._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e0._0_8_ != &local_9d0) {
    operator_delete((void *)local_9e0._0_8_,
                    CONCAT26(local_9d0._M_allocated_capacity._6_2_,
                             CONCAT24(local_9d0._M_allocated_capacity._4_2_,
                                      local_9d0._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458.m_name._M_dataplus._M_p != &local_458.m_name.field_2) {
    operator_delete(local_458.m_name._M_dataplus._M_p,
                    local_458.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0.m_name._M_dataplus._M_p != &local_3f0.m_name.field_2) {
    operator_delete(local_3f0.m_name._M_dataplus._M_p,
                    CONCAT17(local_3f0.m_name.field_2._M_local_buf[7],
                             local_3f0.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.m_desc._M_dataplus._M_p != &local_4c0.m_desc.field_2) {
    operator_delete(local_4c0.m_desc._M_dataplus._M_p,
                    local_4c0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.m_name._M_dataplus._M_p != &local_4c0.m_name.field_2) {
    operator_delete(local_4c0.m_name._M_dataplus._M_p,
                    local_4c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0.m_name._M_dataplus._M_p != &local_8d0.m_name.field_2) {
    operator_delete(local_8d0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8d0.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_8d0.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_8d0.m_name.field_2._M_local_buf[4],
                                               local_8d0.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388.m_name._M_dataplus._M_p != &local_388.m_name.field_2) {
    operator_delete(local_388.m_name._M_dataplus._M_p,
                    CONCAT44(local_388.m_name.field_2._M_allocated_capacity._4_4_,
                             local_388.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  pUVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(samples->
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9) >> 3) *
          -0x49249249) {
    lVar13 = 0;
    lVar12 = 0;
    do {
      uVar14 = *(ulong *)((long)&(pUVar9->duration).fitResponseDuration + lVar13);
      local_9f8._0_4_ =
           (float)*(int *)((long)&pUVar9->writtenSize + lVar13) * local_7fc.coefficient +
           local_7fc.offset;
      local_a60._8_8_ = (pointer)0x0;
      aStack_a50._M_allocated_capacity = 0;
      aStack_a50._8_8_ = 0;
      local_a60._0_8_ = log;
      pSVar10 = tcu::SampleBuilder::operator<<
                          ((SampleBuilder *)local_a60,*(int *)((long)&pUVar9->writtenSize + lVar13))
      ;
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&((samples->
                                                                                                        
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  bufferSize + lVar13));
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&(((samples->
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  duration).totalDuration + lVar13));
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&(((samples->
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  duration).mapDuration + lVar13));
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&(((samples->
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  duration).unmapDuration + lVar13));
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&(((samples->
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  duration).writeDuration + lVar13));
      pSVar10 = tcu::SampleBuilder::operator<<(pSVar10,(float)uVar14 - (float)local_9f8._0_4_);
      tcu::SampleBuilder::operator<<(pSVar10,(EndSampleToken *)&tcu::TestLog::EndSample);
      if ((pointer)local_a60._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_a60._8_8_,aStack_a50._8_8_ - local_a60._8_8_);
      }
      lVar12 = lVar12 + 1;
      pUVar9 = (samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x38;
    } while (lVar12 < (int)((ulong)((long)(samples->
                                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9
                                   ) >> 3) * -0x49249249);
  }
  tcu::TestLog::endSampleList(log);
  tcu::TestLog::endSection((TestLog *)local_320._M_dataplus._M_p);
  local_a60._0_8_ = &aStack_a50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a60,"Contribution","");
  local_ac8._0_8_ = &local_ab8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"Contributions","");
  paVar1 = &local_388.m_name.field_2;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_8f0,log,(string *)local_a60,(string *)local_ac8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._0_8_ != &local_ab8) {
    operator_delete((void *)local_ac8._0_8_,local_ab8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60._0_8_ != &aStack_a50) {
    operator_delete((void *)local_a60._0_8_,aStack_a50._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            ((LineParametersWithConfidence *)local_9e0,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,0)
  ;
  local_868.m_name._M_dataplus._M_p = (pointer)&local_868.m_name.field_2;
  local_868.m_name.field_2._M_allocated_capacity._0_7_ = 0x736e6f4370614d;
  local_868.m_name.field_2._M_local_buf[7] = 't';
  local_868.m_name.field_2._8_7_ = 0x74736f43746e61;
  local_868.m_name._M_string_length = 0xf;
  local_868.m_name.field_2._M_local_buf[0xf] = '\0';
  local_620.m_name._M_dataplus._M_p = (pointer)&local_620.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_620,"Map: Approximated contant cost","");
  local_528.m_name._M_dataplus._M_p = (pointer)&local_528.m_name.field_2;
  local_528.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_528.m_name._M_string_length = 2;
  local_528.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a60,&local_868.m_name,&local_620.m_name,&local_528.m_name,
             QP_KEY_TAG_TIME,(float)local_9e0._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a60._0_8_,local_a40._M_dataplus._M_p,local_a20._M_dataplus._M_p,
             local_a00,local_9fc);
  local_958.m_name._M_dataplus._M_p = (pointer)&local_958.m_name.field_2;
  local_958.m_name.field_2._M_allocated_capacity._0_5_ = 0x694c70614d;
  local_958.m_name.field_2._M_allocated_capacity._5_2_ = 0x656e;
  local_958.m_name.field_2._M_local_buf[7] = 'a';
  local_958.m_name.field_2._8_5_ = 0x74736f4372;
  local_958.m_name._M_string_length = 0xd;
  local_958.m_name.field_2._M_local_buf[0xd] = '\0';
  local_4c0.m_name._M_dataplus._M_p = (pointer)&local_4c0.m_name.field_2;
  local_9c0.m_name._M_dataplus._M_p = (char *)0x1d;
  local_4c0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_4c0,(ulong)&local_9c0);
  local_4c0.m_name.field_2._M_allocated_capacity = (size_type)local_9c0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_4c0.m_name._M_dataplus._M_p,"Map: Approximated linear cost",0x1d);
  local_4c0.m_name._M_string_length = (size_type)local_9c0.m_name._M_dataplus._M_p;
  local_4c0.m_name._M_dataplus._M_p[(long)local_9c0.m_name._M_dataplus._M_p] = '\0';
  local_388.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_388.m_name._M_string_length = 7;
  local_388.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  local_388.m_name._M_dataplus._M_p = (pointer)paVar1;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ac8,&local_958.m_name,&local_4c0.m_name,&local_388.m_name,
             QP_KEY_TAG_TIME,(float)local_9e0._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_ac8._0_8_,local_aa8._M_dataplus._M_p,local_a88._M_dataplus._M_p,
             local_a68,local_a64);
  local_8d0.m_name._M_dataplus._M_p = (pointer)&local_8d0.m_name.field_2;
  local_8d0.m_name.field_2._M_allocated_capacity._0_4_ = 0x4d70614d;
  local_8d0.m_name.field_2._M_local_buf[4] = 'e';
  local_8d0.m_name.field_2._M_allocated_capacity._5_2_ = 0x6964;
  local_8d0.m_name.field_2._M_local_buf[7] = 'a';
  local_8d0.m_name.field_2._8_5_ = 0x74736f436e;
  local_8d0.m_name._M_string_length = 0xd;
  local_8d0.m_name.field_2._M_local_buf[0xd] = '\0';
  local_3f0.m_name._M_dataplus._M_p = (pointer)&local_3f0.m_name.field_2;
  local_458.m_name._M_dataplus._M_p = (pointer)0x10;
  local_3f0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f0,(ulong)&local_458);
  local_3f0.m_name.field_2._M_allocated_capacity._0_7_ = SUB87(local_458.m_name._M_dataplus._M_p,0);
  local_3f0.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_458.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_3f0.m_name._M_dataplus._M_p,"Map: Median cost",0x10);
  local_3f0.m_name._M_string_length = (size_type)local_458.m_name._M_dataplus._M_p;
  local_3f0.m_name._M_dataplus._M_p[(long)local_458.m_name._M_dataplus._M_p] = '\0';
  local_458.m_name._M_dataplus._M_p = (pointer)&local_458.m_name.field_2;
  local_458.m_name._M_string_length = 2;
  local_458.m_name.field_2._M_allocated_capacity._0_3_ = 0x7375;
  tcu::LogNumber<float>::LogNumber
            (&local_9c0,&local_8d0.m_name,&local_3f0.m_name,&local_458.m_name,QP_KEY_TAG_TIME,
             local_f8.medianTime);
  tcu::TestLog::writeFloat
            (log,local_9c0.m_name._M_dataplus._M_p,local_9c0.m_desc._M_dataplus._M_p,
             local_9c0.m_unit._M_dataplus._M_p,local_9c0.m_tag,local_9c0.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0.m_unit._M_dataplus._M_p != &local_9c0.m_unit.field_2) {
    operator_delete(local_9c0.m_unit._M_dataplus._M_p,
                    local_9c0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0.m_desc._M_dataplus._M_p != &local_9c0.m_desc.field_2) {
    operator_delete(local_9c0.m_desc._M_dataplus._M_p,
                    local_9c0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0.m_name._M_dataplus._M_p != &local_9c0.m_name.field_2) {
    operator_delete(local_9c0.m_name._M_dataplus._M_p,
                    local_9c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458.m_name._M_dataplus._M_p != &local_458.m_name.field_2) {
    operator_delete(local_458.m_name._M_dataplus._M_p,
                    local_458.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0.m_name._M_dataplus._M_p != &local_3f0.m_name.field_2) {
    operator_delete(local_3f0.m_name._M_dataplus._M_p,
                    CONCAT17(local_3f0.m_name.field_2._M_local_buf[7],
                             local_3f0.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0.m_name._M_dataplus._M_p != &local_8d0.m_name.field_2) {
    operator_delete(local_8d0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8d0.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_8d0.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_8d0.m_name.field_2._M_local_buf[4],
                                               local_8d0.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._0_8_ != &local_ab8) {
    operator_delete((void *)local_ac8._0_8_,local_ab8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_388.m_name._M_dataplus._M_p,
                    CONCAT44(local_388.m_name.field_2._M_allocated_capacity._4_4_,
                             local_388.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.m_name._M_dataplus._M_p != &local_4c0.m_name.field_2) {
    operator_delete(local_4c0.m_name._M_dataplus._M_p,
                    (ulong)(local_4c0.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_name._M_dataplus._M_p != &local_958.m_name.field_2) {
    operator_delete(local_958.m_name._M_dataplus._M_p,
                    CONCAT17(local_958.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_958.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_958.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
    operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40._M_dataplus._M_p != &local_a40.field_2) {
    operator_delete(local_a40._M_dataplus._M_p,local_a40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60._0_8_ != &aStack_a50) {
    operator_delete((void *)local_a60._0_8_,aStack_a50._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528.m_name._M_dataplus._M_p != &local_528.m_name.field_2) {
    operator_delete(local_528.m_name._M_dataplus._M_p,
                    CONCAT53(local_528.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_528.m_name.field_2._M_local_buf[2],
                                      local_528.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620.m_name._M_dataplus._M_p != &local_620.m_name.field_2) {
    operator_delete(local_620.m_name._M_dataplus._M_p,
                    local_620.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868.m_name._M_dataplus._M_p != &local_868.m_name.field_2) {
    operator_delete(local_868.m_name._M_dataplus._M_p,
                    CONCAT17(local_868.m_name.field_2._M_local_buf[7],
                             local_868.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            ((LineParametersWithConfidence *)local_9e0,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,8)
  ;
  local_868.m_name._M_dataplus._M_p = (pointer)&local_868.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"UnmapConstantCost","");
  local_620.m_name._M_dataplus._M_p = (pointer)&local_620.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_620,"Unmap: Approximated contant cost","");
  local_528.m_name._M_dataplus._M_p = (pointer)&local_528.m_name.field_2;
  local_528.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_528.m_name._M_string_length = 2;
  local_528.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a60,&local_868.m_name,&local_620.m_name,&local_528.m_name,
             QP_KEY_TAG_TIME,(float)local_9e0._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a60._0_8_,local_a40._M_dataplus._M_p,local_a20._M_dataplus._M_p,
             local_a00,local_9fc);
  local_958.m_name._M_dataplus._M_p = (pointer)&local_958.m_name.field_2;
  local_958.m_name.field_2._M_allocated_capacity._0_5_ = 0x70616d6e55;
  local_958.m_name.field_2._M_allocated_capacity._5_2_ = 0x694c;
  local_958.m_name.field_2._M_local_buf[7] = 'n';
  local_958.m_name.field_2._8_5_ = 0x6f43726165;
  local_958.m_name.field_2._M_local_buf[0xd] = 's';
  local_958.m_name.field_2._M_local_buf[0xe] = 't';
  local_958.m_name._M_string_length = 0xf;
  local_958.m_name.field_2._M_local_buf[0xf] = '\0';
  local_4c0.m_name._M_dataplus._M_p = (pointer)&local_4c0.m_name.field_2;
  local_9c0.m_name._M_dataplus._M_p = (char *)0x1f;
  local_4c0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_4c0,(ulong)&local_9c0);
  local_4c0.m_name.field_2._M_allocated_capacity = (size_type)local_9c0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_4c0.m_name._M_dataplus._M_p,"Unmap: Approximated linear cost",0x1f);
  local_4c0.m_name._M_string_length = (size_type)local_9c0.m_name._M_dataplus._M_p;
  local_4c0.m_name._M_dataplus._M_p[(long)local_9c0.m_name._M_dataplus._M_p] = '\0';
  local_388.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_388.m_name._M_string_length = 7;
  local_388.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  local_388.m_name._M_dataplus._M_p = (pointer)paVar1;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ac8,&local_958.m_name,&local_4c0.m_name,&local_388.m_name,
             QP_KEY_TAG_TIME,(float)local_9e0._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_ac8._0_8_,local_aa8._M_dataplus._M_p,local_a88._M_dataplus._M_p,
             local_a68,local_a64);
  local_8d0.m_name._M_dataplus._M_p = (pointer)&local_8d0.m_name.field_2;
  local_8d0.m_name.field_2._M_allocated_capacity._0_4_ = 0x616d6e55;
  local_8d0.m_name.field_2._M_local_buf[4] = 'p';
  local_8d0.m_name.field_2._M_allocated_capacity._5_2_ = 0x654d;
  local_8d0.m_name.field_2._M_local_buf[7] = 'd';
  local_8d0.m_name.field_2._8_5_ = 0x6f436e6169;
  local_8d0.m_name.field_2._M_local_buf[0xd] = 's';
  local_8d0.m_name.field_2._M_local_buf[0xe] = 't';
  local_8d0.m_name._M_string_length = 0xf;
  local_8d0.m_name.field_2._M_local_buf[0xf] = '\0';
  local_3f0.m_name._M_dataplus._M_p = (pointer)&local_3f0.m_name.field_2;
  local_458.m_name._M_dataplus._M_p = (pointer)0x12;
  local_3f0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f0,(ulong)&local_458);
  local_3f0.m_name.field_2._M_allocated_capacity._0_7_ = SUB87(local_458.m_name._M_dataplus._M_p,0);
  local_3f0.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_458.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_3f0.m_name._M_dataplus._M_p,"Unmap: Median cost",0x12);
  local_3f0.m_name._M_string_length = (size_type)local_458.m_name._M_dataplus._M_p;
  local_3f0.m_name._M_dataplus._M_p[(long)local_458.m_name._M_dataplus._M_p] = '\0';
  local_458.m_name._M_dataplus._M_p = (pointer)&local_458.m_name.field_2;
  local_458.m_name._M_string_length = 2;
  local_458.m_name.field_2._M_allocated_capacity._0_3_ = 0x7375;
  tcu::LogNumber<float>::LogNumber
            (&local_9c0,&local_8d0.m_name,&local_3f0.m_name,&local_458.m_name,QP_KEY_TAG_TIME,
             local_e4.medianTime);
  tcu::TestLog::writeFloat
            (log,local_9c0.m_name._M_dataplus._M_p,local_9c0.m_desc._M_dataplus._M_p,
             local_9c0.m_unit._M_dataplus._M_p,local_9c0.m_tag,local_9c0.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0.m_unit._M_dataplus._M_p != &local_9c0.m_unit.field_2) {
    operator_delete(local_9c0.m_unit._M_dataplus._M_p,
                    local_9c0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0.m_desc._M_dataplus._M_p != &local_9c0.m_desc.field_2) {
    operator_delete(local_9c0.m_desc._M_dataplus._M_p,
                    local_9c0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0.m_name._M_dataplus._M_p != &local_9c0.m_name.field_2) {
    operator_delete(local_9c0.m_name._M_dataplus._M_p,
                    local_9c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458.m_name._M_dataplus._M_p != &local_458.m_name.field_2) {
    operator_delete(local_458.m_name._M_dataplus._M_p,
                    local_458.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0.m_name._M_dataplus._M_p != &local_3f0.m_name.field_2) {
    operator_delete(local_3f0.m_name._M_dataplus._M_p,
                    CONCAT17(local_3f0.m_name.field_2._M_local_buf[7],
                             local_3f0.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0.m_name._M_dataplus._M_p != &local_8d0.m_name.field_2) {
    operator_delete(local_8d0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8d0.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_8d0.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_8d0.m_name.field_2._M_local_buf[4],
                                               local_8d0.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._0_8_ != &local_ab8) {
    operator_delete((void *)local_ac8._0_8_,local_ab8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_388.m_name._M_dataplus._M_p,
                    CONCAT44(local_388.m_name.field_2._M_allocated_capacity._4_4_,
                             local_388.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.m_name._M_dataplus._M_p != &local_4c0.m_name.field_2) {
    operator_delete(local_4c0.m_name._M_dataplus._M_p,
                    (ulong)(local_4c0.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_name._M_dataplus._M_p != &local_958.m_name.field_2) {
    operator_delete(local_958.m_name._M_dataplus._M_p,
                    CONCAT17(local_958.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_958.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_958.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
    operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40._M_dataplus._M_p != &local_a40.field_2) {
    operator_delete(local_a40._M_dataplus._M_p,local_a40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60._0_8_ != &aStack_a50) {
    operator_delete((void *)local_a60._0_8_,aStack_a50._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528.m_name._M_dataplus._M_p != &local_528.m_name.field_2) {
    operator_delete(local_528.m_name._M_dataplus._M_p,
                    CONCAT53(local_528.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_528.m_name.field_2._M_local_buf[2],
                                      local_528.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620.m_name._M_dataplus._M_p != &local_620.m_name.field_2) {
    operator_delete(local_620.m_name._M_dataplus._M_p,
                    local_620.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868.m_name._M_dataplus._M_p != &local_868.m_name.field_2) {
    operator_delete(local_868.m_name._M_dataplus._M_p,
                    CONCAT17(local_868.m_name.field_2._M_local_buf[7],
                             local_868.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            ((LineParametersWithConfidence *)local_9e0,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,
             0x10);
  local_868.m_name._M_dataplus._M_p = (pointer)&local_868.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"WriteConstantCost","");
  local_620.m_name._M_dataplus._M_p = (pointer)&local_620.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_620,"Write: Approximated contant cost","");
  local_528.m_name._M_dataplus._M_p = (pointer)&local_528.m_name.field_2;
  local_528.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_528.m_name._M_string_length = 2;
  local_528.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a60,&local_868.m_name,&local_620.m_name,&local_528.m_name,
             QP_KEY_TAG_TIME,(float)local_9e0._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a60._0_8_,local_a40._M_dataplus._M_p,local_a20._M_dataplus._M_p,
             local_a00,local_9fc);
  local_958.m_name._M_dataplus._M_p = (pointer)&local_958.m_name.field_2;
  local_958.m_name.field_2._M_allocated_capacity._0_5_ = 0x6574697257;
  local_958.m_name.field_2._M_allocated_capacity._5_2_ = 0x694c;
  local_958.m_name.field_2._M_local_buf[7] = 'n';
  local_958.m_name.field_2._8_5_ = 0x6f43726165;
  local_958.m_name.field_2._M_local_buf[0xd] = 's';
  local_958.m_name.field_2._M_local_buf[0xe] = 't';
  local_958.m_name._M_string_length = 0xf;
  local_958.m_name.field_2._M_local_buf[0xf] = '\0';
  local_4c0.m_name._M_dataplus._M_p = (pointer)&local_4c0.m_name.field_2;
  local_9c0.m_name._M_dataplus._M_p = (char *)0x1f;
  local_4c0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_4c0,(ulong)&local_9c0);
  local_4c0.m_name.field_2._M_allocated_capacity = (size_type)local_9c0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_4c0.m_name._M_dataplus._M_p,"Write: Approximated linear cost",0x1f);
  local_4c0.m_name._M_string_length = (size_type)local_9c0.m_name._M_dataplus._M_p;
  local_4c0.m_name._M_dataplus._M_p[(long)local_9c0.m_name._M_dataplus._M_p] = '\0';
  local_388.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_388.m_name._M_string_length = 7;
  local_388.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  local_388.m_name._M_dataplus._M_p = (pointer)paVar1;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ac8,&local_958.m_name,&local_4c0.m_name,&local_388.m_name,
             QP_KEY_TAG_TIME,(float)local_9e0._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_ac8._0_8_,local_aa8._M_dataplus._M_p,local_a88._M_dataplus._M_p,
             local_a68,local_a64);
  local_8d0.m_name._M_dataplus._M_p = (pointer)&local_8d0.m_name.field_2;
  local_8d0.m_name.field_2._M_allocated_capacity._0_4_ = 0x74697257;
  local_8d0.m_name.field_2._M_local_buf[4] = 'e';
  local_8d0.m_name.field_2._M_allocated_capacity._5_2_ = 0x654d;
  local_8d0.m_name.field_2._M_local_buf[7] = 'd';
  local_8d0.m_name.field_2._8_5_ = 0x6f436e6169;
  local_8d0.m_name.field_2._M_local_buf[0xd] = 's';
  local_8d0.m_name.field_2._M_local_buf[0xe] = 't';
  local_8d0.m_name._M_string_length = 0xf;
  local_8d0.m_name.field_2._M_local_buf[0xf] = '\0';
  local_3f0.m_name._M_dataplus._M_p = (pointer)&local_3f0.m_name.field_2;
  local_458.m_name._M_dataplus._M_p = (pointer)0x12;
  local_3f0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f0,(ulong)&local_458);
  local_3f0.m_name.field_2._M_allocated_capacity._0_7_ = SUB87(local_458.m_name._M_dataplus._M_p,0);
  local_3f0.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_458.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_3f0.m_name._M_dataplus._M_p,"Write: Median cost",0x12);
  local_3f0.m_name._M_string_length = (size_type)local_458.m_name._M_dataplus._M_p;
  local_3f0.m_name._M_dataplus._M_p[(long)local_458.m_name._M_dataplus._M_p] = '\0';
  local_458.m_name._M_dataplus._M_p = (pointer)&local_458.m_name.field_2;
  local_458.m_name._M_string_length = 2;
  local_458.m_name.field_2._M_allocated_capacity._0_3_ = 0x7375;
  tcu::LogNumber<float>::LogNumber
            (&local_9c0,&local_8d0.m_name,&local_3f0.m_name,&local_458.m_name,QP_KEY_TAG_TIME,
             local_d0[0].medianTime);
  tcu::TestLog::writeFloat
            (log,local_9c0.m_name._M_dataplus._M_p,local_9c0.m_desc._M_dataplus._M_p,
             local_9c0.m_unit._M_dataplus._M_p,local_9c0.m_tag,local_9c0.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0.m_unit._M_dataplus._M_p != &local_9c0.m_unit.field_2) {
    operator_delete(local_9c0.m_unit._M_dataplus._M_p,
                    local_9c0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0.m_desc._M_dataplus._M_p != &local_9c0.m_desc.field_2) {
    operator_delete(local_9c0.m_desc._M_dataplus._M_p,
                    local_9c0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0.m_name._M_dataplus._M_p != &local_9c0.m_name.field_2) {
    operator_delete(local_9c0.m_name._M_dataplus._M_p,
                    local_9c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458.m_name._M_dataplus._M_p != &local_458.m_name.field_2) {
    operator_delete(local_458.m_name._M_dataplus._M_p,
                    local_458.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0.m_name._M_dataplus._M_p != &local_3f0.m_name.field_2) {
    operator_delete(local_3f0.m_name._M_dataplus._M_p,
                    CONCAT17(local_3f0.m_name.field_2._M_local_buf[7],
                             local_3f0.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0.m_name._M_dataplus._M_p != &local_8d0.m_name.field_2) {
    operator_delete(local_8d0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8d0.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_8d0.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_8d0.m_name.field_2._M_local_buf[4],
                                               local_8d0.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._0_8_ != &local_ab8) {
    operator_delete((void *)local_ac8._0_8_,local_ab8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_388.m_name._M_dataplus._M_p,
                    CONCAT44(local_388.m_name.field_2._M_allocated_capacity._4_4_,
                             local_388.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.m_name._M_dataplus._M_p != &local_4c0.m_name.field_2) {
    operator_delete(local_4c0.m_name._M_dataplus._M_p,
                    (ulong)(local_4c0.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_name._M_dataplus._M_p != &local_958.m_name.field_2) {
    operator_delete(local_958.m_name._M_dataplus._M_p,
                    CONCAT17(local_958.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_958.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_958.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
    operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40._M_dataplus._M_p != &local_a40.field_2) {
    operator_delete(local_a40._M_dataplus._M_p,local_a40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60._0_8_ != &aStack_a50) {
    operator_delete((void *)local_a60._0_8_,aStack_a50._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528.m_name._M_dataplus._M_p != &local_528.m_name.field_2) {
    operator_delete(local_528.m_name._M_dataplus._M_p,
                    CONCAT53(local_528.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_528.m_name.field_2._M_local_buf[2],
                                      local_528.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620.m_name._M_dataplus._M_p != &local_620.m_name.field_2) {
    operator_delete(local_620.m_name._M_dataplus._M_p,
                    local_620.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868.m_name._M_dataplus._M_p != &local_868.m_name.field_2) {
    operator_delete(local_868.m_name._M_dataplus._M_p,
                    CONCAT17(local_868.m_name.field_2._M_local_buf[7],
                             local_868.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  tcu::TestLog::endSection((TestLog *)local_8f0._M_dataplus._M_p);
  local_a60._0_8_ = &aStack_a50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a60,"Results","");
  local_ac8._0_8_ = &local_ab8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"Results","");
  tcu::ScopedLogSection::ScopedLogSection(&local_300,log,(string *)local_a60,(string *)local_ac8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._0_8_ != &local_ab8) {
    operator_delete((void *)local_ac8._0_8_,local_ab8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60._0_8_ != &aStack_a50) {
    operator_delete((void *)local_a60._0_8_,aStack_a50._M_allocated_capacity + 1);
  }
  pUVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pUVar3 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar17 = (float)((pUVar3[-1].bufferSize + pUVar9->bufferSize) / 2);
  local_554 = local_7fc.coefficient * fVar17;
  local_550 = local_7fc.offset + local_554;
  endNdx = ((int)((ulong)((long)pUVar3 - (long)pUVar9) >> 3) * -0x49249249) / 2;
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            ((LineParametersWithConfidence *)local_a60,samples,0,endNdx,1,0x20);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            ((LineParametersWithConfidence *)local_ac8,samples,endNdx,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,
             0x20);
  pUVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pUVar3 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar16 = (float)pUVar9->writtenSize;
  local_52c = (float)pUVar3[-1].writtenSize;
  local_9f8._0_4_ = fVar16;
  local_538 = (float)local_a60._0_4_;
  local_48 = ZEXT416((uint)local_a60._12_4_);
  local_534 = (float)local_ac8._0_4_;
  local_58 = ZEXT416((uint)fStack_abc);
  local_530 = getAreaBetweenLines(fVar16,local_52c,(float)local_a60._0_4_,(float)local_a60._12_4_,
                                  (float)local_ac8._0_4_,fStack_abc);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            ((LineParametersWithConfidence *)local_a60,samples,0,
             (int)((ulong)((long)pUVar3 - (long)pUVar9) >> 3) * -0x49249249,2,0x20);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            ((LineParametersWithConfidence *)local_ac8,samples,1,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,2,
             0x20);
  local_53c = (float)((samples->
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->writtenSize;
  local_540 = (float)(samples->
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish[-1].writtenSize;
  local_54c = (float)local_a60._0_4_;
  local_68 = ZEXT416((uint)local_a60._12_4_);
  local_548 = (float)local_ac8._0_4_;
  local_78 = ZEXT416((uint)fStack_abc);
  local_544 = getAreaBetweenLines(local_53c,local_540,(float)local_a60._0_4_,(float)local_a60._12_4_
                                  ,(float)local_ac8._0_4_,fStack_abc);
  local_9e0._0_8_ = &local_9d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9e0,"ResultLinearity","");
  local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f0,"Sample linearity","");
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"%","");
  fVar16 = (float)local_48._0_4_ * (float)local_9f8._0_4_ + local_538;
  fVar18 = (float)local_58._0_4_ * (float)local_9f8._0_4_ + local_534;
  uVar11 = -(uint)(fVar16 <= fVar18);
  fVar19 = (float)local_48._0_4_ * local_52c + local_538;
  fVar20 = (float)local_58._0_4_ * local_52c + local_534;
  uVar15 = -(uint)(fVar20 <= fVar19);
  fVar16 = ((float)(~uVar15 & (uint)fVar20 | (uint)fVar19 & uVar15) -
           (float)(~uVar11 & (uint)fVar18 | (uint)fVar16 & uVar11)) *
           (local_52c - (float)local_9f8._0_4_);
  fVar18 = (float)(~-(uint)(fVar16 < 1e-06) & (uint)(1.0 - local_530 / fVar16));
  fVar16 = 1.0;
  if (fVar18 <= 1.0) {
    fVar16 = fVar18;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a60,(string *)local_9e0,&local_8f0,&local_578,
             QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar18 < 0.0) & (uint)(fVar16 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_a60._0_8_,local_a40._M_dataplus._M_p,local_a20._M_dataplus._M_p,
             local_a00,local_9fc);
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"SampleTemporalStability","")
  ;
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5b8,"Sample temporal stability","");
  local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"%","");
  fVar16 = (float)local_68._0_4_ * local_53c + local_54c;
  fVar18 = (float)local_78._0_4_ * local_53c + local_548;
  uVar11 = -(uint)(fVar16 <= fVar18);
  fVar19 = (float)local_68._0_4_ * local_540 + local_54c;
  fVar20 = (float)local_78._0_4_ * local_540 + local_548;
  uVar15 = -(uint)(fVar20 <= fVar19);
  fVar16 = ((float)(~uVar15 & (uint)fVar20 | (uint)fVar19 & uVar15) -
           (float)(~uVar11 & (uint)fVar18 | (uint)fVar16 & uVar11)) * (local_540 - local_53c);
  fVar18 = (float)(~-(uint)(fVar16 < 1e-06) & (uint)(1.0 - local_544 / fVar16));
  fVar16 = 1.0;
  if (fVar18 <= 1.0) {
    fVar16 = fVar18;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ac8,&local_598,&local_5b8,&local_640,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar18 < 0.0) & (uint)(fVar16 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_ac8._0_8_,local_aa8._M_dataplus._M_p,local_a88._M_dataplus._M_p,
             local_a68,local_a64);
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_660,"ApproximatedConstantCost","");
  local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_680,"Approximated contant cost","");
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_9c0,&local_660,&local_680,&local_6a0,QP_KEY_TAG_TIME,local_7fc.offset);
  tcu::TestLog::writeFloat
            (log,local_9c0.m_name._M_dataplus._M_p,local_9c0.m_desc._M_dataplus._M_p,
             local_9c0.m_unit._M_dataplus._M_p,local_9c0.m_tag,local_9c0.m_value);
  local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6c0,"ApproximatedConstantCostConfidence60Lower","");
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6e0,"Approximated contant cost 60% confidence lower limit","");
  local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_700,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_868,&local_6c0,&local_6e0,&local_700,QP_KEY_TAG_TIME,
             local_7fc.offsetConfidenceLower);
  tcu::TestLog::writeFloat
            (log,local_868.m_name._M_dataplus._M_p,local_868.m_desc._M_dataplus._M_p,
             local_868.m_unit._M_dataplus._M_p,local_868.m_tag,local_868.m_value);
  local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_720,"ApproximatedConstantCostConfidence60Upper","");
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_740,"Approximated contant cost 60% confidence upper limit","");
  local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_620,&local_720,&local_740,&local_760,QP_KEY_TAG_TIME,
             local_7fc.offsetConfidenceUpper);
  tcu::TestLog::writeFloat
            (log,local_620.m_name._M_dataplus._M_p,local_620.m_desc._M_dataplus._M_p,
             local_620.m_unit._M_dataplus._M_p,local_620.m_tag,local_620.m_value);
  local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_780,"ApproximatedLinearCost","");
  local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7a0,"Approximated linear cost","");
  local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_528,&local_780,&local_7a0,&local_7c0,QP_KEY_TAG_TIME,
             local_7fc.coefficient * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_528.m_name._M_dataplus._M_p,local_528.m_desc._M_dataplus._M_p,
             local_528.m_unit._M_dataplus._M_p,local_528.m_tag,local_528.m_value);
  local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7e0,"ApproximatedLinearCostConfidence60Lower","");
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_320,"Approximated linear cost 60% confidence lower limit","");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_958,&local_7e0,&local_320,&local_1d8,QP_KEY_TAG_TIME,
             local_7fc.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_958.m_name._M_dataplus._M_p,local_958.m_desc._M_dataplus._M_p,
             local_958.m_unit._M_dataplus._M_p,local_958.m_tag,local_958.m_value);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,"ApproximatedLinearCostConfidence60Upper","");
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,"Approximated linear cost 60% confidence upper limit","");
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_4c0,&local_1f8,&local_218,&local_238,QP_KEY_TAG_TIME,
             local_7fc.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_4c0.m_name._M_dataplus._M_p,local_4c0.m_desc._M_dataplus._M_p,
             local_4c0.m_unit._M_dataplus._M_p,local_4c0.m_tag,local_4c0.m_value);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"ApproximatedTransferRate","");
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,"Approximated transfer rate","");
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"MB / s","");
  fVar16 = fVar17 / ((local_550 / 1000.0) / 1000.0);
  local_9f8 = ZEXT416((uint)fVar16);
  tcu::LogNumber<float>::LogNumber
            (&local_388,&local_258,&local_278,&local_298,QP_KEY_TAG_PERFORMANCE,
             fVar16 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_388.m_name._M_dataplus._M_p,local_388.m_desc._M_dataplus._M_p,
             local_388.m_unit._M_dataplus._M_p,local_388.m_tag,local_388.m_value);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,"ApproximatedTransferRateNoConstant","");
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d8,"Approximated transfer rate without constant cost","");
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"MB / s","");
  tcu::LogNumber<float>::LogNumber
            (&local_8d0,&local_2b8,&local_2d8,&local_2f8,QP_KEY_TAG_PERFORMANCE,
             (fVar17 / ((local_554 / 1000.0) / 1000.0)) * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_8d0.m_name._M_dataplus._M_p,local_8d0.m_desc._M_dataplus._M_p,
             local_8d0.m_unit._M_dataplus._M_p,local_8d0.m_tag,local_8d0.m_value);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"SampleMedianTime","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Median sample time","");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_3f0,&local_118,&local_138,&local_158,QP_KEY_TAG_TIME,local_a0);
  tcu::TestLog::writeFloat
            (log,local_3f0.m_name._M_dataplus._M_p,local_3f0.m_desc._M_dataplus._M_p,
             local_3f0.m_unit._M_dataplus._M_p,local_3f0.m_tag,local_3f0.m_value);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"SampleMedianTransfer","");
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Median transfer rate","");
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"MB / s","");
  tcu::LogNumber<float>::LogNumber
            (&local_458,&local_178,&local_198,&local_1b8,QP_KEY_TAG_PERFORMANCE,
             local_94 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_458.m_name._M_dataplus._M_p,local_458.m_desc._M_dataplus._M_p,
             local_458.m_unit._M_dataplus._M_p,local_458.m_tag,local_458.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458.m_unit._M_dataplus._M_p != &local_458.m_unit.field_2) {
    operator_delete(local_458.m_unit._M_dataplus._M_p,
                    local_458.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458.m_desc._M_dataplus._M_p != &local_458.m_desc.field_2) {
    operator_delete(local_458.m_desc._M_dataplus._M_p,
                    local_458.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458.m_name._M_dataplus._M_p != &local_458.m_name.field_2) {
    operator_delete(local_458.m_name._M_dataplus._M_p,
                    local_458.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0.m_unit._M_dataplus._M_p != &local_3f0.m_unit.field_2) {
    operator_delete(local_3f0.m_unit._M_dataplus._M_p,
                    local_3f0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0.m_desc._M_dataplus._M_p != &local_3f0.m_desc.field_2) {
    operator_delete(local_3f0.m_desc._M_dataplus._M_p,
                    local_3f0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0.m_name._M_dataplus._M_p != &local_3f0.m_name.field_2) {
    operator_delete(local_3f0.m_name._M_dataplus._M_p,
                    CONCAT17(local_3f0.m_name.field_2._M_local_buf[7],
                             local_3f0.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0.m_unit._M_dataplus._M_p != &local_8d0.m_unit.field_2) {
    operator_delete(local_8d0.m_unit._M_dataplus._M_p,
                    local_8d0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0.m_desc._M_dataplus._M_p != &local_8d0.m_desc.field_2) {
    operator_delete(local_8d0.m_desc._M_dataplus._M_p,
                    local_8d0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0.m_name._M_dataplus._M_p != &local_8d0.m_name.field_2) {
    operator_delete(local_8d0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8d0.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_8d0.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_8d0.m_name.field_2._M_local_buf[4],
                                               local_8d0.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388.m_unit._M_dataplus._M_p != &local_388.m_unit.field_2) {
    operator_delete(local_388.m_unit._M_dataplus._M_p,
                    local_388.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388.m_desc._M_dataplus._M_p != &local_388.m_desc.field_2) {
    operator_delete(local_388.m_desc._M_dataplus._M_p,
                    local_388.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388.m_name._M_dataplus._M_p != &local_388.m_name.field_2) {
    operator_delete(local_388.m_name._M_dataplus._M_p,
                    CONCAT44(local_388.m_name.field_2._M_allocated_capacity._4_4_,
                             local_388.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.m_unit._M_dataplus._M_p != &local_4c0.m_unit.field_2) {
    operator_delete(local_4c0.m_unit._M_dataplus._M_p,
                    local_4c0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.m_desc._M_dataplus._M_p != &local_4c0.m_desc.field_2) {
    operator_delete(local_4c0.m_desc._M_dataplus._M_p,
                    local_4c0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.m_name._M_dataplus._M_p != &local_4c0.m_name.field_2) {
    operator_delete(local_4c0.m_name._M_dataplus._M_p,
                    (ulong)(local_4c0.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_unit._M_dataplus._M_p != &local_958.m_unit.field_2) {
    operator_delete(local_958.m_unit._M_dataplus._M_p,
                    local_958.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_desc._M_dataplus._M_p != &local_958.m_desc.field_2) {
    operator_delete(local_958.m_desc._M_dataplus._M_p,
                    local_958.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958.m_name._M_dataplus._M_p != &local_958.m_name.field_2) {
    operator_delete(local_958.m_name._M_dataplus._M_p,
                    CONCAT17(local_958.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_958.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_958.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
    operator_delete(local_7e0._M_dataplus._M_p,
                    CONCAT53(local_7e0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_7e0.field_2._M_local_buf[2],
                                      local_7e0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528.m_unit._M_dataplus._M_p != &local_528.m_unit.field_2) {
    operator_delete(local_528.m_unit._M_dataplus._M_p,
                    local_528.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528.m_desc._M_dataplus._M_p != &local_528.m_desc.field_2) {
    operator_delete(local_528.m_desc._M_dataplus._M_p,
                    local_528.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528.m_name._M_dataplus._M_p != &local_528.m_name.field_2) {
    operator_delete(local_528.m_name._M_dataplus._M_p,
                    CONCAT53(local_528.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_528.m_name.field_2._M_local_buf[2],
                                      local_528.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
    operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
    operator_delete(local_7a0._M_dataplus._M_p,
                    CONCAT17(local_7a0.field_2._M_local_buf[7],
                             local_7a0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780._M_dataplus._M_p != &local_780.field_2) {
    operator_delete(local_780._M_dataplus._M_p,
                    CONCAT53(local_780.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_780.field_2._M_local_buf[2],
                                      local_780.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620.m_unit._M_dataplus._M_p != &local_620.m_unit.field_2) {
    operator_delete(local_620.m_unit._M_dataplus._M_p,
                    local_620.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620.m_desc._M_dataplus._M_p != &local_620.m_desc.field_2) {
    operator_delete(local_620.m_desc._M_dataplus._M_p,
                    local_620.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620.m_name._M_dataplus._M_p != &local_620.m_name.field_2) {
    operator_delete(local_620.m_name._M_dataplus._M_p,
                    local_620.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._M_dataplus._M_p != &local_760.field_2) {
    operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_720._M_dataplus._M_p != &local_720.field_2) {
    operator_delete(local_720._M_dataplus._M_p,
                    CONCAT53(local_720.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_720.field_2._M_local_buf[2],
                                      local_720.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868.m_unit._M_dataplus._M_p != &local_868.m_unit.field_2) {
    operator_delete(local_868.m_unit._M_dataplus._M_p,
                    local_868.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868.m_desc._M_dataplus._M_p != &local_868.m_desc.field_2) {
    operator_delete(local_868.m_desc._M_dataplus._M_p,
                    local_868.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868.m_name._M_dataplus._M_p != &local_868.m_name.field_2) {
    operator_delete(local_868.m_name._M_dataplus._M_p,
                    CONCAT17(local_868.m_name.field_2._M_local_buf[7],
                             local_868.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700._M_dataplus._M_p != &local_700.field_2) {
    operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
    operator_delete(local_6c0._M_dataplus._M_p,
                    CONCAT53(local_6c0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_6c0.field_2._M_local_buf[2],
                                      local_6c0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0.m_unit._M_dataplus._M_p != &local_9c0.m_unit.field_2) {
    operator_delete(local_9c0.m_unit._M_dataplus._M_p,
                    local_9c0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0.m_desc._M_dataplus._M_p != &local_9c0.m_desc.field_2) {
    operator_delete(local_9c0.m_desc._M_dataplus._M_p,
                    local_9c0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0.m_name._M_dataplus._M_p != &local_9c0.m_name.field_2) {
    operator_delete(local_9c0.m_name._M_dataplus._M_p,
                    local_9c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_680._M_dataplus._M_p != &local_680.field_2) {
    operator_delete(local_680._M_dataplus._M_p,
                    CONCAT44(local_680.field_2._M_allocated_capacity._4_4_,
                             local_680.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p,
                    CONCAT53(local_660.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_660.field_2._M_local_buf[2],
                                      local_660.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._0_8_ != &local_ab8) {
    operator_delete((void *)local_ac8._0_8_,local_ab8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != &local_640.field_2) {
    operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,
                    CONCAT26(local_598.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_598.field_2._M_allocated_capacity._4_2_,
                                      local_598.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
    operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40._M_dataplus._M_p != &local_a40.field_2) {
    operator_delete(local_a40._M_dataplus._M_p,local_a40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60._0_8_ != &aStack_a50) {
    operator_delete((void *)local_a60._0_8_,aStack_a50._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,
                    CONCAT17(local_578.field_2._M_local_buf[7],
                             local_578.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
    operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e0._0_8_ != &local_9d0) {
    operator_delete((void *)local_9e0._0_8_,
                    CONCAT26(local_9d0._M_allocated_capacity._6_2_,
                             CONCAT24(local_9d0._M_allocated_capacity._4_2_,
                                      local_9d0._M_allocated_capacity._0_4_)) + 1);
  }
  tcu::TestLog::endSection(local_300.m_log);
  UVar21.transferRateAtRange = (float)local_9f8._0_4_;
  UVar21.transferRateMedian = local_94;
  UVar21.transferRateAtInfinity = local_94;
  return UVar21;
}

Assistant:

static UploadSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<UploadSampleResult<SampleType> >& samples, bool logBucketPerformance)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedTransferRate;
	float													approximatedTransferRateNoConstant;

	// Output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Calculate results for different ranges
	if (logBucketPerformance)
	{
		const int										numBuckets				= 4;
		int												minBufferSize			= 0;
		int												maxBufferSize			= 0;
		std::vector<UploadSampleResult<SampleType> >	buckets[numBuckets];

		bucketizeSamplesUniformly(samples, &buckets[0], numBuckets, minBufferSize, maxBufferSize);

		for (int bucketNdx = 0; bucketNdx < numBuckets; ++bucketNdx)
		{
			if (buckets[bucketNdx].empty())
				continue;

			// Print a nice result summary

			const int												bucketRangeMin	= minBufferSize + (int)(((float) bucketNdx    / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const int												bucketRangeMax	= minBufferSize + (int)(((float)(bucketNdx+1) / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const typename SampleTypeTraits<SampleType>::StatsType	stats			= calculateSampleStatistics(theilSenFitting, buckets[bucketNdx]);
			const tcu::ScopedLogSection								section			(log, "BufferSizeRange", std::string("Transfer performance with buffer size in range [").append(getHumanReadableByteSize(bucketRangeMin).append(", ").append(getHumanReadableByteSize(bucketRangeMax).append("]"))));

			logMapRangeStats<SampleType>(log, stats);
			logUnmapStats<SampleType>(log, stats);
			logWriteStats<SampleType>(log, stats);
			logFlushStats<SampleType>(log, stats);
			logAllocStats<SampleType>(log, stats);

			log	<< tcu::TestLog::Float("Min", "Total: Min time", "us", QP_KEY_TAG_TIME, stats.result.minTime)
				<< tcu::TestLog::Float("Max", "Total: Max time", "us", QP_KEY_TAG_TIME, stats.result.maxTime)
				<< tcu::TestLog::Float("Min90", "Total: 90%-Min time", "us", QP_KEY_TAG_TIME, stats.result.min2DecileTime)
				<< tcu::TestLog::Float("Max90", "Total: 90%-Max time", "us", QP_KEY_TAG_TIME, stats.result.max9DecileTime)
				<< tcu::TestLog::Float("Median", "Total: Median time", "us", QP_KEY_TAG_TIME, stats.result.medianTime)
				<< tcu::TestLog::Float("MedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, stats.medianRate / 1024.0f / 1024.0f)
				<< tcu::TestLog::Float("MaxDiff", "Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiffTime)
				<< tcu::TestLog::Float("Max90Diff", "90%-Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiff9DecileTime)
				<< tcu::TestLog::Float("MedianDiff", "Median difference to approximated", "us", QP_KEY_TAG_TIME, stats.medianDiffTime)
				<< tcu::TestLog::Float("MaxRelDiff", "Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.maxRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("Max90RelDiff", "90%-Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.max9DecileRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("MedianRelDiff", "Median relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.medianRelDiffTime * 100.0f);
		}
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logMapContribution(log, samples, resultStats);
		logUnmapContribution(log, samples, resultStats);
		logWriteContribution(log, samples, resultStats);
		logFlushContribution(log, samples, resultStats);
		logAllocContribution(log, samples, resultStats);
	}

	// Print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianBufferSize					= (samples.front().bufferSize + samples.back().bufferSize) / 2;
		const float	approximatedTransferTime			= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	approximatedTransferTimeNoConstant	= (theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedTransferRateNoConstant				= (float)medianBufferSize / approximatedTransferTimeNoConstant;
		approximatedTransferRate						= (float)medianBufferSize / approximatedTransferTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRate", "Approximated transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRateNoConstant", "Approximated transfer rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated transfer rate
	{
		UploadSampleAnalyzeResult result;

		result.transferRateMedian = resultStats.medianRate;
		result.transferRateAtRange = approximatedTransferRate;
		result.transferRateAtInfinity = approximatedTransferRateNoConstant;

		return result;
	}
}